

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O2

DecodeStatus decodeBDAddr20Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  DecodeStatus extraout_EAX;
  uint Reg;
  
  Reg = 0;
  if (0xfffff < Field) {
    Reg = Regs[Field >> 0x14];
  }
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateImm0
            (Inst,(long)((ulong)((uint)Field >> 8 & 0xfff | (uint)Field << 0xc) << 0x2c) >> 0x2c);
  return extraout_EAX;
}

Assistant:

static DecodeStatus decodeBDAddr20Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Base = Field >> 20;
	uint64_t Disp = ((Field << 12) & 0xff000) | ((Field >> 8) & 0xfff);
	//assert(Base < 16 && "Invalid BDAddr20");

	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, SignExtend64(Disp, 20));
	return MCDisassembler_Success;
}